

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPolygonOffsetTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_0::UsagePositiveNegativeTestCase::testPolygonOffset
          (UsagePositiveNegativeTestCase *this)

{
  code *pcVar1;
  TestContext *testCtx;
  undefined *puVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  TestLog *this_00;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  TestError *this_01;
  MessageBuilder *pMVar7;
  VertexShader *pVVar8;
  FragmentShader *pFVar9;
  VertexAttrib *local_15a0;
  ConstPixelBufferAccess local_14d8;
  ConstPixelBufferAccess local_14b0;
  PrimitiveList local_1488;
  Program local_1468;
  MultisamplePixelBufferAccess local_1450;
  MultisamplePixelBufferAccess local_1428;
  PixelBufferAccess local_1400;
  MultisamplePixelBufferAccess local_13d8;
  RenderTarget local_13b0;
  DrawCommand local_12b8;
  Vector<float,_4> local_1288;
  PrimitiveList local_1278;
  Program local_1258;
  MultisamplePixelBufferAccess local_1240;
  MultisamplePixelBufferAccess local_1218;
  PixelBufferAccess local_11f0;
  MultisamplePixelBufferAccess local_11c8;
  RenderTarget local_11a0;
  DrawCommand local_10a8;
  MessageBuilder local_1078;
  Vector<float,_4> local_ef8;
  PixelBufferAccess local_ee8;
  Vector<float,_4> local_ec0;
  undefined1 local_eb0 [8];
  PositionColorShader program_1;
  ViewportState local_d44;
  undefined1 local_d2c [8];
  RenderState state;
  VertexAttrib attribs [2];
  Renderer local_be9;
  undefined1 local_be8 [7];
  Renderer referenceRenderer;
  MessageBuilder local_bc0;
  MessageBuilder local_a40;
  MessageBuilder local_8c0;
  MessageBuilder local_740;
  MessageBuilder local_5c0;
  MessageBuilder local_440;
  undefined4 local_2bc;
  undefined4 local_2b8;
  GLint colorLoc;
  GLint positionLoc;
  allocator<char> local_289;
  string local_288;
  ProgramSources local_268;
  undefined1 local_198 [8];
  ShaderProgram program;
  Functions *gl;
  undefined1 local_b0 [8];
  Surface referenceImage;
  Surface testImage;
  TestLog *log;
  Vec4 triangleTopLeft [3];
  Vec4 triangleBottomRight [3];
  UsagePositiveNegativeTestCase *this_local;
  
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(triangleTopLeft[2].m_data + 2),-1.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(triangleBottomRight[0].m_data + 2),1.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(triangleBottomRight[1].m_data + 2),1.0,-1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&log,-1.0,-1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(triangleTopLeft[0].m_data + 2),-1.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(triangleTopLeft[1].m_data + 2),1.0,-1.0,0.0,1.0);
  this_00 = tcu::TestContext::getLog
                      ((this->super_PolygonOffsetTestCase).super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx);
  iVar4 = (this->super_PolygonOffsetTestCase).m_targetSize;
  tcu::Surface::Surface((Surface *)&referenceImage.m_pixels.m_cap,iVar4,iVar4);
  iVar4 = (this->super_PolygonOffsetTestCase).m_targetSize;
  tcu::Surface::Surface((Surface *)local_b0,iVar4,iVar4);
  pRVar6 = gles3::Context::getRenderContext
                     ((this->super_PolygonOffsetTestCase).super_TestCase.m_context);
  iVar4 = (*pRVar6->_vptr_RenderContext[3])();
  program.m_program.m_info.linkTimeUs = CONCAT44(extraout_var,iVar4);
  pRVar6 = gles3::Context::getRenderContext
                     ((this->super_PolygonOffsetTestCase).super_TestCase.m_context);
  puVar2 = Functional::(anonymous_namespace)::s_shaderSourceVertex;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,puVar2,&local_289);
  puVar2 = Functional::(anonymous_namespace)::s_shaderSourceFragment;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&positionLoc,puVar2,(allocator<char> *)((long)&colorLoc + 3));
  glu::makeVtxFragSources(&local_268,&local_288,(string *)&positionLoc);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_198,pRVar6,&local_268);
  glu::ProgramSources::~ProgramSources(&local_268);
  std::__cxx11::string::~string((string *)&positionLoc);
  std::allocator<char>::~allocator((allocator<char> *)((long)&colorLoc + 3));
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator(&local_289);
  pcVar1 = *(code **)(program.m_program.m_info.linkTimeUs + 0x780);
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_198);
  local_2b8 = (*pcVar1)(dVar5,"a_position");
  pcVar1 = *(code **)(program.m_program.m_info.linkTimeUs + 0x780);
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_198);
  local_2bc = (*pcVar1)(dVar5,"a_color");
  bVar3 = glu::ShaderProgram::isOk((ShaderProgram *)local_198);
  if (!bVar3) {
    glu::operator<<(this_00,(ShaderProgram *)local_198);
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Shader compile failed.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fPolygonOffsetTests.cpp"
               ,0x271);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1d0))(0x3f800000);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x188))(0x4100);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1a00))
            (0,0,(this->super_PolygonOffsetTestCase).m_targetSize);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x4a0))(0x201);
  pcVar1 = *(code **)(program.m_program.m_info.linkTimeUs + 0x1680);
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_198);
  (*pcVar1)(dVar5);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x5e0))(0xb71);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x5e0))(0x8037);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x610))(local_2b8);
  tcu::TestLog::operator<<(&local_440,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<(&local_440,(char (*) [21])"DepthFunc = GL_LESS.");
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_440);
  tcu::TestLog::operator<<(&local_5c0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<(&local_5c0,(char (*) [29])0x2b7f2b3);
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_5c0);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x19f0))(local_2b8,4,0x1406,0,0,&log);
  tcu::TestLog::operator<<(&local_740,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<
                     (&local_740,
                      (char (*) [58])"Draw top-left. Color = White.\tState: PolygonOffset(0, 0).");
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_740);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1028))(0);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1858))
            (0x3f800000,0x3f800000,0x3f800000,local_2bc);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x538))(4,0,3);
  tcu::TestLog::operator<<(&local_8c0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<
                     (&local_8c0,
                      (char (*) [59])"Draw top-left. Color = Green.\tState: PolygonOffset(0, -1).");
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_8c0);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1028))(0,0xbf800000);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1858))(0,0x3f800000,local_2bc);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x538))(4,0,3);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x19f0))
            (local_2b8,4,0x1406,0,0,triangleTopLeft[2].m_data + 2);
  tcu::TestLog::operator<<(&local_a40,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<
                     (&local_a40,
                      (char (*) [62])
                      "Draw bottom-right. Color = White.\tState: PolygonOffset(0, 1).");
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_a40);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1028))(0,0x3f800000);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1858))(0x3f800000,0x3f800000,local_2bc);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x538))(4,0,3);
  tcu::TestLog::operator<<(&local_bc0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<
                     (&local_bc0,
                      (char (*) [63])
                      "Draw bottom-right. Color = Yellow.\tState: PolygonOffset(0, 0).");
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_bc0);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1028))(0);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1858))(0x3f800000,0x3f800000,local_2bc);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x538))(4,0,3);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x518))(local_2b8);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1680))(0);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x648))();
  pRVar6 = gles3::Context::getRenderContext
                     ((this->super_PolygonOffsetTestCase).super_TestCase.m_context);
  tcu::Surface::getAccess((PixelBufferAccess *)local_be8,(Surface *)&referenceImage.m_pixels.m_cap);
  glu::readPixels(pRVar6,0,0,(PixelBufferAccess *)local_be8);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_198);
  rr::Renderer::Renderer(&local_be9);
  local_15a0 = (VertexAttrib *)&state.restart.restartIndex;
  do {
    rr::VertexAttrib::VertexAttrib(local_15a0);
    local_15a0 = local_15a0 + 1;
  } while (local_15a0 != (VertexAttrib *)((long)&attribs[1].generic.v + 8));
  iVar4 = (this->super_PolygonOffsetTestCase).m_targetSize;
  rr::WindowRectangle::WindowRectangle
            ((WindowRectangle *)&program_1.super_ShaderProgram.field_0x154,0,0,iVar4,iVar4);
  rr::ViewportState::ViewportState
            (&local_d44,(WindowRectangle *)&program_1.super_ShaderProgram.field_0x154);
  rr::RenderState::RenderState((RenderState *)local_d2c,&local_d44,VIEWPORTORIENTATION_LOWER_LEFT);
  PositionColorShader::PositionColorShader((PositionColorShader *)local_eb0);
  state.restart.restartIndex = 0;
  state.viewportOrientation = 4;
  attribs[0].type = VERTEXATTRIBTYPE_FLOAT;
  attribs[0].size = 0;
  attribs[0]._8_8_ = &log;
  attribs[0].generic.v.uData[2] = 0x22;
  tcu::Vector<float,_4>::Vector(&local_ec0,0.0,1.0,0.0,1.0);
  rr::GenericVec4::operator=((GenericVec4 *)&attribs[1].pointer,&local_ec0);
  tcu::Surface::getAccess(&local_ee8,(Surface *)local_b0);
  tcu::Vector<float,_4>::Vector(&local_ef8,0.0,0.0,0.0,1.0);
  tcu::clear(&local_ee8,&local_ef8);
  tcu::TestLog::operator<<(&local_1078,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<
                     (&local_1078,
                      (char (*) [52])"Expecting: Top-left = Green, Bottom-right = Yellow.");
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1078);
  tcu::Surface::getAccess(&local_11f0,(Surface *)local_b0);
  rr::MultisamplePixelBufferAccess::fromSinglesampleAccess(&local_11c8,&local_11f0);
  rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess(&local_1218);
  rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess(&local_1240);
  rr::RenderTarget::RenderTarget(&local_11a0,&local_11c8,&local_1218,&local_1240);
  pVVar8 = sglr::ShaderProgram::getVertexShader((ShaderProgram *)local_eb0);
  pFVar9 = sglr::ShaderProgram::getFragmentShader((ShaderProgram *)local_eb0);
  rr::Program::Program(&local_1258,pVVar8,pFVar9,(GeometryShader *)0x0);
  rr::PrimitiveList::PrimitiveList(&local_1278,PRIMITIVETYPE_TRIANGLES,3,0);
  rr::DrawCommand::DrawCommand
            (&local_10a8,(RenderState *)local_d2c,&local_11a0,&local_1258,2,
             (VertexAttrib *)&state.restart.restartIndex,&local_1278);
  rr::Renderer::draw(&local_be9,&local_10a8);
  attribs[0]._8_8_ = triangleTopLeft[2].m_data + 2;
  tcu::Vector<float,_4>::Vector(&local_1288,1.0,1.0,0.0,1.0);
  rr::GenericVec4::operator=((GenericVec4 *)&attribs[1].pointer,&local_1288);
  tcu::Surface::getAccess(&local_1400,(Surface *)local_b0);
  rr::MultisamplePixelBufferAccess::fromSinglesampleAccess(&local_13d8,&local_1400);
  rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess(&local_1428);
  rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess(&local_1450);
  rr::RenderTarget::RenderTarget(&local_13b0,&local_13d8,&local_1428,&local_1450);
  pVVar8 = sglr::ShaderProgram::getVertexShader((ShaderProgram *)local_eb0);
  pFVar9 = sglr::ShaderProgram::getFragmentShader((ShaderProgram *)local_eb0);
  rr::Program::Program(&local_1468,pVVar8,pFVar9,(GeometryShader *)0x0);
  rr::PrimitiveList::PrimitiveList(&local_1488,PRIMITIVETYPE_TRIANGLES,3,0);
  rr::DrawCommand::DrawCommand
            (&local_12b8,(RenderState *)local_d2c,&local_13b0,&local_1468,2,
             (VertexAttrib *)&state.restart.restartIndex,&local_1488);
  rr::Renderer::draw(&local_be9,&local_12b8);
  PositionColorShader::~PositionColorShader((PositionColorShader *)local_eb0);
  rr::Renderer::~Renderer(&local_be9);
  testCtx = (this->super_PolygonOffsetTestCase).super_TestCase.super_TestCase.super_TestNode.
            m_testCtx;
  pRVar6 = gles3::Context::getRenderContext
                     ((this->super_PolygonOffsetTestCase).super_TestCase.m_context);
  tcu::Surface::getAccess
            ((PixelBufferAccess *)&local_14b0,(Surface *)&referenceImage.m_pixels.m_cap);
  tcu::Surface::getAccess((PixelBufferAccess *)&local_14d8,(Surface *)local_b0);
  verifyImages(this_00,testCtx,pRVar6,&local_14b0,&local_14d8);
  tcu::Surface::~Surface((Surface *)local_b0);
  tcu::Surface::~Surface((Surface *)&referenceImage.m_pixels.m_cap);
  return;
}

Assistant:

void UsagePositiveNegativeTestCase::testPolygonOffset (void)
{
	using tcu::TestLog;

	const tcu::Vec4 triangleBottomRight[] =
	{
		tcu::Vec4(-1,  1,  0,  1),
		tcu::Vec4( 1,  1,  0,  1),
		tcu::Vec4( 1, -1,  0,  1),
	};
	const tcu::Vec4 triangleTopLeft[] =
	{
		tcu::Vec4(-1, -1,  0,  1),
		tcu::Vec4(-1,  1,  0,  1),
		tcu::Vec4( 1, -1,  0,  1),
	};

	tcu::TestLog&		log				= m_testCtx.getLog();
	tcu::Surface		testImage		(m_targetSize, m_targetSize);
	tcu::Surface		referenceImage	(m_targetSize, m_targetSize);

	// render test image
	{
		const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
		const glu::ShaderProgram	program			(m_context.getRenderContext(), glu::makeVtxFragSources(s_shaderSourceVertex, s_shaderSourceFragment));
		const GLint					positionLoc		= gl.getAttribLocation(program.getProgram(), "a_position");
		const GLint					colorLoc		= gl.getAttribLocation(program.getProgram(), "a_color");

		if (!program.isOk())
		{
			log << program;
			TCU_FAIL("Shader compile failed.");
		}

		gl.clearColor				(0, 0, 0, 1);
		gl.clearDepthf				(1.0f);
		gl.clear					(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
		gl.viewport					(0, 0, m_targetSize, m_targetSize);
		gl.depthFunc				(GL_LESS);
		gl.useProgram				(program.getProgram());
		gl.enable					(GL_DEPTH_TEST);
		gl.enable					(GL_POLYGON_OFFSET_FILL);
		gl.enableVertexAttribArray	(positionLoc);

		log << TestLog::Message << "DepthFunc = GL_LESS." << TestLog::EndMessage;
		log << TestLog::Message << "POLYGON_OFFSET_FILL enabled." << TestLog::EndMessage;

		//draw top left (negative offset test)
		{
			gl.vertexAttribPointer		(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, triangleTopLeft);

			log << TestLog::Message << "Draw top-left. Color = White.\tState: PolygonOffset(0, 0)." << TestLog::EndMessage;

			gl.polygonOffset			(0, 0);
			gl.vertexAttrib4f			(colorLoc, 1.0f, 1.0f, 1.0f, 1.0f);
			gl.drawArrays				(GL_TRIANGLES, 0, 3);

			log << TestLog::Message << "Draw top-left. Color = Green.\tState: PolygonOffset(0, -1)." << TestLog::EndMessage;

			gl.polygonOffset			(0, -1);
			gl.vertexAttrib4f			(colorLoc, 0.0f, 1.0f, 0.0f, 1.0f);
			gl.drawArrays				(GL_TRIANGLES, 0, 3);
		}

		//draw bottom right (positive offset test)
		{
			gl.vertexAttribPointer		(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, triangleBottomRight);

			log << TestLog::Message << "Draw bottom-right. Color = White.\tState: PolygonOffset(0, 1)." << TestLog::EndMessage;

			gl.polygonOffset			(0, 1);
			gl.vertexAttrib4f			(colorLoc, 1.0f, 1.0f, 1.0f, 1.0f);
			gl.drawArrays				(GL_TRIANGLES, 0, 3);

			log << TestLog::Message << "Draw bottom-right. Color = Yellow.\tState: PolygonOffset(0, 0)." << TestLog::EndMessage;

			gl.polygonOffset			(0, 0);
			gl.vertexAttrib4f			(colorLoc, 1.0f, 1.0f, 0.0f, 1.0f);
			gl.drawArrays				(GL_TRIANGLES, 0, 3);
		}

		gl.disableVertexAttribArray	(positionLoc);
		gl.useProgram				(0);
		gl.finish					();

		glu::readPixels(m_context.getRenderContext(), 0, 0, testImage.getAccess());
	}

	// render reference image
	{
		rr::Renderer		referenceRenderer;
		rr::VertexAttrib	attribs[2];
		rr::RenderState		state((rr::ViewportState)(rr::WindowRectangle(0, 0, m_targetSize, m_targetSize)));

		PositionColorShader program;

		attribs[0].type				= rr::VERTEXATTRIBTYPE_FLOAT;
		attribs[0].size				= 4;
		attribs[0].stride			= 0;
		attribs[0].instanceDivisor	= 0;
		attribs[0].pointer			= triangleTopLeft;

		attribs[1].type				= rr::VERTEXATTRIBTYPE_DONT_CARE;
		attribs[1].generic			= tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f);

		tcu::clear(referenceImage.getAccess(), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

		log << TestLog::Message << "Expecting: Top-left = Green, Bottom-right = Yellow." << TestLog::EndMessage;

		referenceRenderer.draw(
			rr::DrawCommand(
				state,
				rr::RenderTarget(rr::MultisamplePixelBufferAccess::fromSinglesampleAccess(referenceImage.getAccess())),
				rr::Program(program.getVertexShader(), program.getFragmentShader()),
				2,
				attribs,
				rr::PrimitiveList(rr::PRIMITIVETYPE_TRIANGLES, 3, 0)));

		attribs[0].pointer = triangleBottomRight;
		attribs[1].generic = tcu::Vec4(1.0f, 1.0f, 0.0f, 1.0f);

		referenceRenderer.draw(
			rr::DrawCommand(
				state,
				rr::RenderTarget(rr::MultisamplePixelBufferAccess::fromSinglesampleAccess(referenceImage.getAccess())),
				rr::Program(program.getVertexShader(), program.getFragmentShader()),
				2,
				attribs,
				rr::PrimitiveList(rr::PRIMITIVETYPE_TRIANGLES, 3, 0)));
	}

	// compare
	verifyImages(log, m_testCtx, m_context.getRenderContext(), testImage.getAccess(), referenceImage.getAccess());
}